

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::__cxx11::string_const&>::
captureExpression<(Catch::Internal::Operator)0,char[2]>
          (ExpressionLhs<std::__cxx11::string_const&> *this,char (*rhs) [2])

{
  int iVar1;
  ResultBuilder *pRVar2;
  char *value;
  string local_80;
  string local_60;
  string local_40;
  
  pRVar2 = *(ResultBuilder **)this;
  iVar1 = std::__cxx11::string::compare(*(char **)(this + 8));
  pRVar2 = ResultBuilder::setResultType(pRVar2,iVar1 == 0);
  Catch::toString(&local_80,*(string **)(this + 8));
  pRVar2 = ResultBuilder::setLhs(pRVar2,&local_80);
  Catch::toString_abi_cxx11_(&local_60,(Catch *)rhs,value);
  pRVar2 = ResultBuilder::setRhs(pRVar2,&local_60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"==","");
  pRVar2 = ResultBuilder::setOp(pRVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }